

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O1

uint read_pbm_integer(j_compress_ptr cinfo,FILE *infile,uint maxval)

{
  jpeg_error_mgr *pjVar1;
  int iVar2;
  uint uVar3;
  
  do {
    iVar2 = pbm_getc(infile);
    uVar3 = iVar2 + 1;
    if (0x21 < uVar3) goto LAB_00115d0f;
  } while ((0x200004c00U >> ((ulong)uVar3 & 0x3f) & 1) != 0);
  if ((ulong)uVar3 == 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x2b;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
LAB_00115d0f:
  if (iVar2 - 0x3aU < 0xfffffff6) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x3f7;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  uVar3 = iVar2 - 0x30;
  iVar2 = pbm_getc(infile);
  while (iVar2 - 0x30U < 10) {
    uVar3 = (iVar2 - 0x30U) + uVar3 * 10;
    if (maxval < uVar3) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x3f9;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    iVar2 = pbm_getc(infile);
  }
  return uVar3;
}

Assistant:

LOCAL(unsigned int)
read_pbm_integer(j_compress_ptr cinfo, FILE *infile, unsigned int maxval)
/* Read an unsigned decimal integer from the PPM file */
/* Swallows one trailing character after the integer */
/* Note that on a 16-bit-int machine, only values up to 64k can be read. */
/* This should not be a problem in practice. */
{
  register int ch;
  register unsigned int val;

  /* Skip any leading whitespace */
  do {
    ch = pbm_getc(infile);
    if (ch == EOF)
      ERREXIT(cinfo, JERR_INPUT_EOF);
  } while (ch == ' ' || ch == '\t' || ch == '\n' || ch == '\r');

  if (ch < '0' || ch > '9')
    ERREXIT(cinfo, JERR_PPM_NONNUMERIC);

  val = ch - '0';
  while ((ch = pbm_getc(infile)) >= '0' && ch <= '9') {
    val *= 10;
    val += ch - '0';
    if (val > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
  }

  return val;
}